

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_stack.h
# Opt level: O2

type dukglue::detail::get_stack_values_helper<int,int,int,0ul,1ul,2ul>
               (_Tuple_impl<1UL,_int,_int> ctx,duk_context *param_2)

{
  _Head_base<0UL,_int,_false> extraout_EDX;
  type tVar1;
  int32_t local_44;
  int32_t local_40;
  int32_t local_3c;
  tuple<int_&&,_int_&&,_int_&&> local_38;
  
  local_3c = types::DukType<int>::read<int>(param_2,0);
  local_40 = types::DukType<int>::read<int>(param_2,1);
  local_44 = types::DukType<int>::read<int>(param_2,2);
  local_38.super__Tuple_impl<0UL,_int_&&,_int_&&,_int_&&>.super__Tuple_impl<1UL,_int_&&,_int_&&>.
  super__Tuple_impl<2UL,_int_&&>.super__Head_base<2UL,_int_&&,_false>._M_head_impl =
       (_Head_base<2UL,_int_&&,_false>)&local_44;
  local_38.super__Tuple_impl<0UL,_int_&&,_int_&&,_int_&&>.super__Tuple_impl<1UL,_int_&&,_int_&&>.
  super__Head_base<1UL,_int_&&,_false>._M_head_impl = &local_40;
  local_38.super__Tuple_impl<0UL,_int_&&,_int_&&,_int_&&>.super__Head_base<0UL,_int_&&,_false>.
  _M_head_impl = &local_3c;
  std::tuple<int,_int,_int>::tuple<int_&&,_int_&&,_int_&&,_true,_true>
            ((tuple<int,_int,_int> *)ctx,&local_38);
  tVar1.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
       extraout_EDX._M_head_impl;
  tVar1.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int> = ctx;
  return (type)tVar1.super__Tuple_impl<0UL,_int,_int,_int>;
}

Assistant:

typename ArgsTuple<Args...>::type get_stack_values_helper(duk_context* ctx, dukglue::detail::index_tuple<Indexes...>)
		{
			using namespace dukglue::types;
			return std::forward_as_tuple(DukType<typename Bare<Args>::type>::template read<typename ArgStorage<Args>::type>(ctx, Indexes)...);
		}